

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage.cc
# Opt level: O0

bool __thiscall
tinyusdz::Stage::find_prim_by_prim_id(Stage *this,uint64_t prim_id,Prim **prim,string *err)

{
  bool bVar1;
  pointer ppVar2;
  vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *pvVar3;
  reference root_00;
  mapped_type *ppPVar4;
  Prim *root;
  const_iterator __end1;
  const_iterator __begin1;
  vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *__range1;
  Prim *p;
  _Self local_38;
  iterator ret;
  string *err_local;
  Prim **prim_local;
  uint64_t prim_id_local;
  Stage *this_local;
  
  ret._M_node = (_Base_ptr)err;
  prim_local = (Prim **)prim_id;
  prim_id_local = (uint64_t)this;
  if (prim_id == 0) {
    if (err != (string *)0x0) {
      std::__cxx11::string::operator=((string *)err,"Input prim_id must be 1 or greater.");
    }
  }
  else {
    if ((this->_prim_id_dirty & 1U) == 0) {
      local_38._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_const_tinyusdz::Prim_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_tinyusdz::Prim_*>_>_>
           ::find(&this->_prim_id_cache,(key_type *)&prim_local);
      p = (Prim *)std::
                  map<unsigned_long,_const_tinyusdz::Prim_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_tinyusdz::Prim_*>_>_>
                  ::end(&this->_prim_id_cache);
      bVar1 = std::operator!=(&local_38,(_Self *)&p);
      if (bVar1) {
        ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_const_tinyusdz::Prim_*>_>::
                 operator->(&local_38);
        *prim = ppVar2->second;
        return true;
      }
    }
    else {
      std::
      map<unsigned_long,_const_tinyusdz::Prim_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_tinyusdz::Prim_*>_>_>
      ::clear(&this->_prim_id_cache);
      this->_prim_id_dirty = false;
    }
    __range1 = (vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)0x0;
    pvVar3 = root_prims(this);
    __end1 = std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::begin(pvVar3);
    root = (Prim *)std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::end(pvVar3);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
                                       *)&root), bVar1) {
      root_00 = __gnu_cxx::
                __normal_iterator<const_tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
                ::operator*(&__end1);
      bVar1 = anon_unknown_28::FindPrimByPrimIdRec
                        ((uint64_t)prim_local,root_00,(Prim **)&__range1,0,(string *)ret._M_node);
      pvVar3 = __range1;
      if (bVar1) {
        ppPVar4 = std::
                  map<unsigned_long,_const_tinyusdz::Prim_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_tinyusdz::Prim_*>_>_>
                  ::operator[](&this->_prim_id_cache,(key_type *)&prim_local);
        *ppPVar4 = (mapped_type)pvVar3;
        *prim = (Prim *)__range1;
        return true;
      }
      __gnu_cxx::
      __normal_iterator<const_tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
      ::operator++(&__end1);
    }
  }
  return false;
}

Assistant:

bool Stage::find_prim_by_prim_id(const uint64_t prim_id, const Prim *&prim,
                                 std::string *err) const {
  if (prim_id < 1) {
    if (err) {
      (*err) = "Input prim_id must be 1 or greater.";
    }
    return false;
  }

  if (_prim_id_dirty) {
    DCOUT("clear prim_id cache.");
    // Clear cache.
    _prim_id_cache.clear();

    _prim_id_dirty = false;
  } else {
    // First find from a cache.
    auto ret = _prim_id_cache.find(prim_id);
    if (ret != _prim_id_cache.end()) {
      DCOUT("Found cache.");
      prim = ret->second;
      return true;
    }
  }

  const Prim *p{nullptr};
  for (const auto &root : root_prims()) {
    if (FindPrimByPrimIdRec(prim_id, &root, &p, 0, err)) {
      _prim_id_cache[prim_id] = p;
      prim = p;
      return true;
    }
  }

  return false;
}